

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SpecparamDeclaratorSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SpecparamDeclaratorSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::ExpressionSyntax*&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1,Token *args_2,ExpressionSyntax *args_3,
          Token *args_4,ExpressionSyntax **args_5,Token *args_6)

{
  Token equals;
  Token name;
  Token closeParen;
  SpecparamDeclaratorSyntax *pSVar1;
  Token *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  Token *in_R9;
  undefined8 *in_stack_00000008;
  undefined8 *in_stack_00000010;
  size_t in_stack_ffffffffffffff38;
  size_t in_stack_ffffffffffffff40;
  BumpAllocator *in_stack_ffffffffffffff48;
  Info *in_stack_ffffffffffffff60;
  
  pSVar1 = (SpecparamDeclaratorSyntax *)
           allocate(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  name.info = (Info *)*in_stack_00000010;
  name._0_8_ = pSVar1;
  equals.info = in_stack_ffffffffffffff60;
  equals._0_8_ = in_stack_00000010[1];
  closeParen.info = (Info *)*in_RSI;
  closeParen._0_8_ = in_RDX[1];
  slang::syntax::SpecparamDeclaratorSyntax::SpecparamDeclaratorSyntax
            ((SpecparamDeclaratorSyntax *)*in_stack_00000010,name,equals,*in_R9,
             (ExpressionSyntax *)*in_stack_00000008,*in_RCX,(ExpressionSyntax *)*in_RDX,closeParen);
  return pSVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }